

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

value * __thiscall cppcms::json::value::operator[](value *this,size_t n)

{
  json_type jVar1;
  undefined8 uVar2;
  array *paVar3;
  string *psVar4;
  const_reference pvVar5;
  string *in_RSI;
  json_type in_stack_00000120;
  json_type in_stack_00000124;
  string *in_stack_00000128;
  bad_value_cast *in_stack_00000130;
  string *s;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  allocator local_69;
  string local_68 [35];
  undefined1 local_45;
  allocator local_31;
  string local_30 [32];
  string *local_10;
  
  local_10 = in_RSI;
  jVar1 = type((value *)0x3e4b89);
  if (jVar1 != is_array) {
    local_45 = 1;
    uVar2 = __cxa_allocate_exception(0x48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"",&local_31);
    type((value *)0x3e4bd7);
    bad_value_cast::bad_value_cast
              (in_stack_00000130,in_stack_00000128,in_stack_00000124,in_stack_00000120);
    local_45 = 0;
    __cxa_throw(uVar2,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
  }
  s = local_10;
  paVar3 = array((value *)0x3e4c7a);
  psVar4 = (string *)
           std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>::size(paVar3);
  if (psVar4 <= s) {
    uVar2 = __cxa_allocate_exception(0x48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Index out of range",&local_69);
    bad_value_cast::bad_value_cast
              ((bad_value_cast *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),s);
    __cxa_throw(uVar2,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
  }
  paVar3 = array((value *)0x3e4d4b);
  pvVar5 = std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>::operator[]
                     (paVar3,(size_type)local_10);
  return pvVar5;
}

Assistant:

value const &value::operator[](size_t n) const
	{
		if(type()!=json::is_array)
			throw bad_value_cast("",type(),json::is_array);
		if(n >= array().size())
			throw bad_value_cast("Index out of range");
		return array()[n];
	}